

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip::groebnerRow62_100000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  double factor;
  Index in_stack_fffffffffffffe68;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *in_stack_fffffffffffffe70;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0x1025b90);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025bb1);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025bde);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025c0c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025c30);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *pSVar2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar27,auVar50);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025c86);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025caa);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pSVar2;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar28,auVar51);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025d00);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025d24);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *pSVar2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar29,auVar52);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025d7a);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025d9e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *pSVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar30,auVar53);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025df4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025e18);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *pSVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar31,auVar54);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025e6e);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025e92);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *pSVar2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar32,auVar55);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025ee8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025f0c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *pSVar2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar33,auVar56);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025f65);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025f8c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *pSVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar34,auVar57);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1025feb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026012);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *pSVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar35,auVar58);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026071);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026098);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *pSVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar36,auVar59);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10260f7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x102611e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *pSVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar37,auVar60);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x102617d);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10261a4);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *pSVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar15,auVar38,auVar61);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026203);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x102622a);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *pSVar2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar16,auVar39,auVar62);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026289);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10262b0);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *pSVar2;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar17,auVar40,auVar63);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x102630f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026336);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar1;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *pSVar2;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar18,auVar41,auVar64);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026395);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10263bc);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SVar1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *pSVar2;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar19,auVar42,auVar65);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x102641b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026442);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = SVar1;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *pSVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar20,auVar43,auVar66);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10264a1);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10264c8);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = SVar1;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *pSVar2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar21,auVar44,auVar67);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026527);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x102654e);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = SVar1;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *pSVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar22,auVar45,auVar68);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10265ad);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10265d4);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = SVar1;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *pSVar2;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar23,auVar46,auVar69);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026633);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x102665a);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = SVar1;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *pSVar2;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar24,auVar47,auVar70);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10266b9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x10266e0);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = SVar1;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *pSVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar25,auVar48,auVar71);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x102673f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,in_stack_fffffffffffffe68,0x1026766);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = SVar1;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *pSVar2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar26,auVar49,auVar72);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow62_100000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,126) / groebnerMatrix(62,171);
  groebnerMatrix(targetRow,126) = 0.0;
  groebnerMatrix(targetRow,128) -= factor * groebnerMatrix(62,173);
  groebnerMatrix(targetRow,129) -= factor * groebnerMatrix(62,174);
  groebnerMatrix(targetRow,131) -= factor * groebnerMatrix(62,176);
  groebnerMatrix(targetRow,132) -= factor * groebnerMatrix(62,177);
  groebnerMatrix(targetRow,133) -= factor * groebnerMatrix(62,178);
  groebnerMatrix(targetRow,134) -= factor * groebnerMatrix(62,179);
  groebnerMatrix(targetRow,135) -= factor * groebnerMatrix(62,180);
  groebnerMatrix(targetRow,136) -= factor * groebnerMatrix(62,181);
  groebnerMatrix(targetRow,137) -= factor * groebnerMatrix(62,182);
  groebnerMatrix(targetRow,138) -= factor * groebnerMatrix(62,183);
  groebnerMatrix(targetRow,139) -= factor * groebnerMatrix(62,184);
  groebnerMatrix(targetRow,140) -= factor * groebnerMatrix(62,185);
  groebnerMatrix(targetRow,141) -= factor * groebnerMatrix(62,186);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(62,187);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(62,188);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(62,189);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(62,190);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(62,191);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(62,192);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(62,193);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(62,194);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(62,195);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(62,196);
}